

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_ObjPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  int iFan;
  int i;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pAStack_18;
  int fShowFanouts;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if (pObj == (Aig_Obj_t *)0x0) {
    printf("Object is NULL.");
  }
  else {
    iVar2 = Aig_IsComplement(pObj);
    pAStack_18 = pObj;
    if (iVar2 != 0) {
      printf("Compl ");
      pAStack_18 = Aig_Not(pObj);
    }
    iVar2 = Aig_IsComplement(pAStack_18);
    if (iVar2 != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x14a,"void Aig_ObjPrint(Aig_Man_t *, Aig_Obj_t *)");
    }
    uVar3 = Aig_ObjId(pAStack_18);
    printf("Node %4d : ",(ulong)uVar3);
    iVar2 = Aig_ObjIsConst1(pAStack_18);
    if (iVar2 == 0) {
      iVar2 = Aig_ObjIsCi(pAStack_18);
      if (iVar2 == 0) {
        iVar2 = Aig_ObjIsCo(pAStack_18);
        if (iVar2 == 0) {
          iVar2 = Aig_ObjIsBuf(pAStack_18);
          if (iVar2 == 0) {
            pAVar4 = Aig_ObjFanin0(pAStack_18);
            uVar3 = pAVar4->Id;
            iVar2 = Aig_ObjFaninC0(pAStack_18);
            pcVar5 = " ";
            if (iVar2 != 0) {
              pcVar5 = "\'";
            }
            pAVar4 = Aig_ObjFanin1(pAStack_18);
            uVar1 = pAVar4->Id;
            iVar2 = Aig_ObjFaninC1(pAStack_18);
            pcVar6 = " ";
            if (iVar2 != 0) {
              pcVar6 = "\'";
            }
            printf("AND( %4d%s, %4d%s )",(ulong)uVar3,pcVar5,(ulong)uVar1,pcVar6);
          }
          else {
            pAVar4 = Aig_ObjFanin0(pAStack_18);
            uVar3 = pAVar4->Id;
            iVar2 = Aig_ObjFaninC0(pAStack_18);
            pcVar5 = " ";
            if (iVar2 != 0) {
              pcVar5 = "\'";
            }
            printf("BUF( %d%s )",(ulong)uVar3,pcVar5);
          }
        }
        else {
          pAVar4 = Aig_ObjFanin0(pAStack_18);
          uVar3 = pAVar4->Id;
          iVar2 = Aig_ObjFaninC0(pAStack_18);
          pcVar5 = " ";
          if (iVar2 != 0) {
            pcVar5 = "\'";
          }
          printf("PO( %4d%s )",(ulong)uVar3,pcVar5);
        }
      }
      else {
        printf("PI");
      }
    }
    else {
      printf("constant 1");
    }
    uVar3 = Aig_ObjRefs(pAStack_18);
    printf(" (refs = %3d)",(ulong)uVar3);
    if ((p->pEquivs == (Aig_Obj_t **)0x0) || (p->pEquivs[pAStack_18->Id] == (Aig_Obj_t *)0x0)) {
      if ((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[pAStack_18->Id] != (Aig_Obj_t *)0x0)) {
        printf("  class of %d",(ulong)(uint)pAStack_18->Id);
      }
    }
    else {
      printf("  { %4d ",(ulong)(uint)pAStack_18->Id);
      for (pFanout = p->pEquivs[pAStack_18->Id]; pFanout != (Aig_Obj_t *)0x0;
          pFanout = p->pEquivs[pFanout->Id]) {
        pcVar5 = " ";
        if (((uint)(*(ulong *)&pFanout->field_0x18 >> 3) & 1) !=
            ((uint)(*(ulong *)&pAStack_18->field_0x18 >> 3) & 1)) {
          pcVar5 = "\'";
        }
        printf(" %4d%s",(ulong)(uint)pFanout->Id,pcVar5);
      }
      printf(" }");
    }
  }
  return;
}

Assistant:

void Aig_ObjPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int fShowFanouts = 0;
    Aig_Obj_t * pTemp;
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    if ( Aig_IsComplement(pObj) )
    {
        printf( "Compl " );
        pObj = Aig_Not(pObj);
    }
    assert( !Aig_IsComplement(pObj) );
    printf( "Node %4d : ", Aig_ObjId(pObj) );
    if ( Aig_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Aig_ObjIsCi(pObj) )
        printf( "PI" );
    else if ( Aig_ObjIsCo(pObj) )
        printf( "PO( %4d%s )", Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Aig_ObjIsBuf(pObj) )
        printf( "BUF( %d%s )", Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " "), 
            Aig_ObjFanin1(pObj)->Id, (Aig_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Aig_ObjRefs(pObj) );
    if ( fShowFanouts && p->pFanData )
    {
        Aig_Obj_t * pFanout;
        int i;
        int iFan = -1; // Suppress "might be used uninitialized"
        printf( "\nFanouts:\n" );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFan, i )
        {
            printf( "    " );
            printf( "Node %4d : ", Aig_ObjId(pFanout) );
            if ( Aig_ObjIsCo(pFanout) )
                printf( "PO( %4d%s )", Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Aig_ObjIsBuf(pFanout) )
                printf( "BUF( %d%s )", Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %4d%s, %4d%s )", 
                    Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " "), 
                    Aig_ObjFanin1(pFanout)->Id, (Aig_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        return;
    }
    // there are choices
    if ( p->pEquivs && p->pEquivs[pObj->Id] )
    {
        // print equivalence class
        printf( "  { %4d ", pObj->Id );
        for ( pTemp = p->pEquivs[pObj->Id]; pTemp; pTemp = p->pEquivs[pTemp->Id] )
            printf( " %4d%s", pTemp->Id, (pTemp->fPhase != pObj->fPhase)? "\'" : " " );
        printf( " }" );
        return;
    }
    // this is a secondary node
    if ( p->pReprs && p->pReprs[pObj->Id] )
        printf( "  class of %d", pObj->Id );
}